

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplaceValue<QStyleSheetStyleCaches::Tampered<QFont>>
          (Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *this,
          Tampered<QFont> *args)

{
  long lVar1;
  Tampered<QFont> *in_RDI;
  long in_FS_OFFSET;
  Tampered<QFont> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleSheetStyleCaches::Tampered<QFont>::Tampered(in_RDI,in_stack_ffffffffffffffb8);
  QStyleSheetStyleCaches::Tampered<QFont>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QStyleSheetStyleCaches::Tampered<QFont>::~Tampered((Tampered<QFont> *)0x47f63b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }